

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.hpp
# Opt level: O0

result_type __thiscall trng::mt19937::operator()(mt19937 *this)

{
  int iVar1;
  uint uVar2;
  result_type x;
  result_type x_1;
  result_type x_3;
  result_type x_2;
  int i;
  result_type mag01 [2];
  mt19937 *this_local;
  
  mag01[0] = 0;
  mag01[1] = 0x9908b0df;
  if (0x26f < (this->S).mti) {
    for (i = 0; i < 0xe3; i = i + 1) {
      uVar2 = (this->S).mt[i + 1];
      (this->S).mt[i] =
           (this->S).mt[i + 0x18d] ^ ((this->S).mt[i] & 0x80000000 | uVar2 & 0x7fffffff) >> 1 ^
           mag01[uVar2 & 1];
    }
    for (; i < 0x26f; i = i + 1) {
      uVar2 = (this->S).mt[i + 1];
      (this->S).mt[i] =
           (this->S).mt[i + -0xe3] ^ ((this->S).mt[i] & 0x80000000 | uVar2 & 0x7fffffff) >> 1 ^
           mag01[uVar2 & 1];
    }
    uVar2 = (this->S).mt[0];
    (this->S).mt[0x26f] =
         (this->S).mt[0x18c] ^ ((this->S).mt[0x26f] & 0x80000000 | uVar2 & 0x7fffffff) >> 1 ^
         mag01[uVar2 & 1];
    (this->S).mti = 0;
  }
  iVar1 = (this->S).mti;
  (this->S).mti = iVar1 + 1;
  uVar2 = (this->S).mt[iVar1];
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

inline mt19937::result_type mt19937::operator()() {
    const result_type mag01[2]{0u, 0x9908b0dfu};
    if (S.mti >= N) {  // generate N words at one time
      int i{0};
      for (; i < N - M; ++i) {
        const result_type x{(S.mt[i] & mt19937::UM) | (S.mt[i + 1] & mt19937::LM)};
        S.mt[i] = S.mt[i + M] ^ (x >> 1u) ^ mag01[x & 0x1u];
      }
      for (; i < N - 1; ++i) {
        const result_type x{(S.mt[i] & mt19937::UM) | (S.mt[i + 1] & LM)};
        S.mt[i] = S.mt[i + (M - N)] ^ (x >> 1u) ^ mag01[x & 0x1u];
      }
      const result_type x{(S.mt[N - 1] & mt19937::UM) | (S.mt[0] & mt19937::LM)};
      S.mt[N - 1] = S.mt[M - 1] ^ (x >> 1u) ^ mag01[x & 0x1u];
      S.mti = 0;
    }
    result_type x{S.mt[S.mti++]};
    x ^= (x >> 11u);
    x ^= (x << 7u) & 0x9d2c5680u;
    x ^= (x << 15u) & 0xefc60000u;
    x ^= (x >> 18u);
    return x;
  }